

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workerThread.cpp
# Opt level: O1

void __thiscall WorkerThread::WorkerThread(WorkerThread *this,WorkerThread *wt)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Task_state_base<void_()> *__tmp;
  thread local_40;
  packaged_task<void_()> local_38;
  
  *(undefined8 *)((long)&(this->taskMutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->taskMutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->taskMutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->taskMutex).super___mutex_base._M_mutex + 8) = 0;
  (this->taskMutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->workerThread)._M_id._M_thread = 0;
  (this->task)._M_state.
  super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->task)._M_state.
  super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::condition_variable::condition_variable(&this->taskCV);
  LOCK();
  (this->stopMe)._M_base._M_i = false;
  UNLOCK();
  peVar1 = (wt->task)._M_state.
           super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  (wt->task)._M_state.
  super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  p_Var2 = (wt->task)._M_state.
           super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (wt->task)._M_state.
  super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_38._M_state.
  super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (this->task)._M_state.
           super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_38._M_state.
  super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (this->task)._M_state.
       super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  (this->task)._M_state.
  super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar1;
  (this->task)._M_state.
  super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  std::packaged_task<void_()>::~packaged_task(&local_38);
  this->taskPresence = wt->taskPresence;
  local_40._M_id._M_thread = (id)0;
  local_38._M_state.
  super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)operator_new(0x10);
  ((local_38._M_state.
    super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
   _M_ptr)->super__State_base)._vptr__State_baseV2 = (_func_int **)&PTR___State_00110d18;
  ((local_38._M_state.
    super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
   _M_ptr)->super__State_base)._M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)this;
  std::thread::_M_start_thread(&local_40,&local_38,0);
  if (local_38._M_state.
      super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0) {
    (*((local_38._M_state.
        super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr)->super__State_base)._vptr__State_baseV2[1])();
  }
  if ((this->workerThread)._M_id._M_thread == 0) {
    (this->workerThread)._M_id._M_thread = (native_handle_type)local_40._M_id._M_thread;
    return;
  }
  std::terminate();
}

Assistant:

WorkerThread::WorkerThread (WorkerThread&& wt) {
	stopMe			= false;
	task			= std::move(wt.task);
	taskPresence	= wt.taskPresence;
	workerThread	= std::thread ([&] {
		workerFunction ();
	});
}